

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

LLVMValueRef CompileLlvmFunctionDefinition(LlvmCompilationContext *ctx,ExprFunctionDefinition *node)

{
  InplaceStr *pIVar1;
  LLVMBuilderRef pLVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  LLVMValueRefOpaque **ppLVar7;
  LLVMTypeRef pLVar8;
  LLVMValueRef pLVar9;
  char *pcVar10;
  LLVMValueRef pLVar11;
  VariableData **ppVVar12;
  LLVMValueRef pLVar13;
  ExprBase *local_138;
  ExprBase *value;
  LLVMBasicBlockRef restoreBlock;
  LLVMValueRef pLStack_120;
  uint i_1;
  LLVMValueRef switchInst;
  LLVMBasicBlockRef startBlock;
  LLVMValueRef state;
  char *local_100;
  LLVMValueRef local_f8;
  LLVMValueRef storage_2;
  VariableHandle *curr_1;
  VariableData *pVStack_e0;
  bool isArgument;
  VariableData *variable_2;
  LLVMValueRef pLStack_d0;
  uint i;
  LLVMValueRef argument_2;
  undefined8 local_c0;
  LLVMValueRef local_b8;
  LLVMValueRef storage_1;
  VariableData *variable_1;
  LLVMValueRef argument_1;
  undefined8 local_98;
  LLVMValueRef local_90;
  LLVMValueRef storage;
  LLVMValueRef argument;
  VariableData *variable;
  VariableHandle *curr;
  LLVMBasicBlockRef pLStack_68;
  uint argIndex;
  LLVMBasicBlockRef block;
  FunctionData *currentFunctionSource;
  LLVMValueRef currentFunction;
  LLVMValueRef result;
  LLVMValueRef constants [2];
  LLVMValueRef function_1;
  LLVMValueRef function;
  ExprFunctionDefinition *node_local;
  LlvmCompilationContext *ctx_local;
  
  ppLVar7 = SmallArray<LLVMValueRefOpaque_*,_128U>::operator[]
                      (&ctx->functions,node->function->functionIndex);
  pLVar9 = *ppLVar7;
  if ((ctx->skipFunctionDefinitions & 1U) == 0) {
    if ((node->function->isPrototype & 1U) == 0) {
      ctx->skipFunctionDefinitions = true;
      currentFunctionSource = (FunctionData *)ctx->currentFunction;
      block = (LLVMBasicBlockRef)ctx->currentFunctionSource;
      ctx->currentFunction = pLVar9;
      ctx->currentFunctionSource = node->function;
      if (ctx->currentNextRestoreBlock != 0) {
        __assert_fail("ctx.currentNextRestoreBlock == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                      ,0x6a9,
                      "LLVMValueRef CompileLlvmFunctionDefinition(LlvmCompilationContext &, ExprFunctionDefinition *)"
                     );
      }
      bVar4 = SmallArray<LLVMBasicBlockRefOpaque_*,_16U>::empty(&ctx->currentRestoreBlocks);
      if (!bVar4) {
        __assert_fail("ctx.currentRestoreBlocks.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                      ,0x6aa,
                      "LLVMValueRef CompileLlvmFunctionDefinition(LlvmCompilationContext &, ExprFunctionDefinition *)"
                     );
      }
      pLStack_68 = LLVMAppendBasicBlockInContext(ctx->context,ctx->currentFunction,"start");
      LLVMPositionBuilderAtEnd(ctx->builder,pLStack_68);
      curr._4_4_ = 0;
      bVar4 = IsStructReturnType(node->function->type->returnType);
      if (bVar4) {
        curr._4_4_ = curr._4_4_ + 1;
      }
      for (variable = (VariableData *)(node->function->argumentVariables).head;
          variable != (VariableData *)0x0; variable = (VariableData *)variable->scope) {
        argument = (LLVMValueRef)variable->importModule;
        bVar4 = IsStructArgumentType((TypeBase *)((ModuleData *)argument)->bytecode);
        uVar3 = curr._4_4_;
        if (bVar4) {
          curr._4_4_ = curr._4_4_ + 1;
          storage = LLVMGetParam(pLVar9,uVar3);
          ppLVar7 = SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>
                    ::find(&ctx->variables,(uint *)(argument + 0x40));
          if (ppLVar7 != (LLVMValueRefOpaque **)0x0) {
            __assert_fail("!ctx.variables.find(variable->uniqueId)",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                          ,0x6be,
                          "LLVMValueRef CompileLlvmFunctionDefinition(LlvmCompilationContext &, ExprFunctionDefinition *)"
                         );
          }
          SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>::
          insert(&ctx->variables,(uint *)(argument + 0x40),&storage);
        }
        else {
          pLVar2 = ctx->builder;
          pLVar8 = CompileLlvmType(ctx,*(TypeBase **)(argument + 0x20));
          pIVar1 = (InplaceStr *)(*(long *)(argument + 0x28) + 0x40);
          argument_1 = (LLVMValueRef)pIVar1->begin;
          local_98 = *(undefined8 *)(*(long *)(argument + 0x28) + 0x48);
          pcVar10 = CreateLlvmName(ctx,*pIVar1);
          local_90 = LLVMBuildAlloca(pLVar2,pLVar8,pcVar10);
          uVar3 = curr._4_4_;
          curr._4_4_ = curr._4_4_ + 1;
          variable_1 = (VariableData *)LLVMGetParam(pLVar9,uVar3);
          LLVMBuildStore(ctx->builder,(LLVMValueRef)variable_1,local_90);
          ppLVar7 = SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>
                    ::find(&ctx->variables,(uint *)(argument + 0x40));
          if (ppLVar7 != (LLVMValueRefOpaque **)0x0) {
            __assert_fail("!ctx.variables.find(variable->uniqueId)",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                          ,0x6ca,
                          "LLVMValueRef CompileLlvmFunctionDefinition(LlvmCompilationContext &, ExprFunctionDefinition *)"
                         );
          }
          SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>::
          insert(&ctx->variables,(uint *)(argument + 0x40),&local_90);
        }
      }
      storage_1 = (LLVMValueRef)node->function->contextArgument;
      if ((VariableData *)storage_1 != (VariableData *)0x0) {
        pLVar2 = ctx->builder;
        pLVar8 = CompileLlvmType(ctx,((VariableData *)storage_1)->type);
        pIVar1 = (InplaceStr *)(*(long *)(storage_1 + 0x28) + 0x40);
        argument_2 = (LLVMValueRef)pIVar1->begin;
        local_c0 = *(undefined8 *)(*(long *)(storage_1 + 0x28) + 0x48);
        pcVar10 = CreateLlvmName(ctx,*pIVar1);
        local_b8 = LLVMBuildAlloca(pLVar2,pLVar8,pcVar10);
        uVar3 = curr._4_4_;
        curr._4_4_ = curr._4_4_ + 1;
        pLVar11 = LLVMGetParam(pLVar9,uVar3);
        pLVar2 = ctx->builder;
        pLStack_d0 = pLVar11;
        pLVar8 = CompileLlvmType(ctx,node->function->contextType);
        pLStack_d0 = LLVMBuildPointerCast(pLVar2,pLVar11,pLVar8,"context_reinterpret");
        LLVMBuildStore(ctx->builder,pLStack_d0,local_b8);
        ppLVar7 = SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>
                  ::find(&ctx->variables,(uint *)(storage_1 + 0x40));
        if (ppLVar7 != (LLVMValueRefOpaque **)0x0) {
          __assert_fail("!ctx.variables.find(variable->uniqueId)",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                        ,0x6da,
                        "LLVMValueRef CompileLlvmFunctionDefinition(LlvmCompilationContext &, ExprFunctionDefinition *)"
                       );
        }
        SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>::insert
                  (&ctx->variables,(uint *)(storage_1 + 0x40),&local_b8);
      }
      for (variable_2._4_4_ = 0; uVar3 = variable_2._4_4_,
          uVar5 = SmallArray<VariableData_*,_4U>::size(&node->function->functionScope->allVariables)
          , uVar3 < uVar5; variable_2._4_4_ = variable_2._4_4_ + 1) {
        ppVVar12 = SmallArray<VariableData_*,_4U>::operator[]
                             (&node->function->functionScope->allVariables,variable_2._4_4_);
        pVStack_e0 = *ppVVar12;
        curr_1._7_1_ = '\0';
        for (storage_2 = (LLVMValueRef)(node->function->argumentVariables).head;
            storage_2 != (LLVMValueRef)0x0; storage_2 = *(LLVMValueRef *)(storage_2 + 0x10)) {
          if (pVStack_e0 == *(VariableData **)(storage_2 + 8)) {
            curr_1._7_1_ = '\x01';
            break;
          }
        }
        if ((curr_1._7_1_ == '\0') && (pVStack_e0 != node->function->contextArgument)) {
          pLVar2 = ctx->builder;
          pLVar8 = CompileLlvmType(ctx,pVStack_e0->type);
          pIVar1 = &pVStack_e0->name->name;
          state = (LLVMValueRef)pIVar1->begin;
          local_100 = (pVStack_e0->name->name).end;
          pcVar10 = CreateLlvmName(ctx,*pIVar1);
          local_f8 = LLVMBuildAlloca(pLVar2,pLVar8,pcVar10);
          ppLVar7 = SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>
                    ::find(&ctx->variables,&pVStack_e0->uniqueId);
          if (ppLVar7 != (LLVMValueRefOpaque **)0x0) {
            __assert_fail("!ctx.variables.find(variable->uniqueId)",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                          ,0x6f4,
                          "LLVMValueRef CompileLlvmFunctionDefinition(LlvmCompilationContext &, ExprFunctionDefinition *)"
                         );
          }
          SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>::
          insert(&ctx->variables,&pVStack_e0->uniqueId,&local_f8);
        }
      }
      if ((node->function->coroutine & 1U) != 0) {
        startBlock = (LLVMBasicBlockRef)CompileLlvm(ctx,node->coroutineStateRead);
        switchInst = (LLVMValueRef)
                     LLVMAppendBasicBlockInContext(ctx->context,ctx->currentFunction,"start");
        pLStack_120 = LLVMBuildSwitch(ctx->builder,(LLVMValueRef)startBlock,
                                      (LLVMBasicBlockRef)switchInst,node->function->yieldCount);
        LLVMPositionBuilderAtEnd(ctx->builder,(LLVMBasicBlockRef)switchInst);
        for (restoreBlock._4_4_ = 0; restoreBlock._4_4_ < node->function->yieldCount;
            restoreBlock._4_4_ = restoreBlock._4_4_ + 1) {
          value = (ExprBase *)
                  LLVMAppendBasicBlockInContext(ctx->context,ctx->currentFunction,"restore");
          pLVar11 = pLStack_120;
          pLVar8 = CompileLlvmType(ctx,ctx->ctx->typeInt);
          pLVar13 = LLVMConstInt(pLVar8,(ulong)(restoreBlock._4_4_ + 1),true);
          LLVMAddCase(pLVar11,pLVar13,(LLVMBasicBlockRef)value);
          SmallArray<LLVMBasicBlockRefOpaque_*,_16U>::push_back
                    (&ctx->currentRestoreBlocks,(LLVMBasicBlockRefOpaque **)&value);
        }
      }
      for (local_138 = (node->expressions).head; local_138 != (ExprBase *)0x0;
          local_138 = local_138->next) {
        CompileLlvm(ctx,local_138);
      }
      pLVar2 = ctx->builder;
      pLVar11 = LLVMGetNamedFunction(ctx->module,"__llvmAbortNoReturn");
      LLVMBuildCall(pLVar2,pLVar11,(LLVMValueRef *)0x0,0,"");
      if ((node->function->type->returnType == ctx->ctx->typeVoid) ||
         (bVar4 = IsStructReturnType(node->function->type->returnType), bVar4)) {
        LLVMBuildRetVoid(ctx->builder);
      }
      else {
        pLVar2 = ctx->builder;
        pLVar8 = CompileLlvmType(ctx,node->function->type->returnType);
        pLVar11 = LLVMConstNull(pLVar8);
        LLVMBuildRet(pLVar2,pLVar11);
      }
      CheckFunction(ctx,ctx->currentFunction,node->function->name->name);
      iVar6 = LLVMRunFunctionPassManager(ctx->functionPassManager,pLVar9);
      if (iVar6 != 0) {
        LLVMRunFunctionPassManager(ctx->functionPassManager,pLVar9);
      }
      ctx->currentFunction = (LLVMValueRef)currentFunctionSource;
      ctx->currentFunctionSource = (FunctionData *)block;
      ctx->currentNextRestoreBlock = 0;
      SmallArray<LLVMBasicBlockRefOpaque_*,_16U>::clear(&ctx->currentRestoreBlocks);
      ctx->skipFunctionDefinitions = false;
      ctx_local = (LlvmCompilationContext *)0x0;
    }
    else {
      ctx_local = (LlvmCompilationContext *)0x0;
    }
  }
  else {
    pLVar2 = ctx->builder;
    ppLVar7 = SmallArray<LLVMValueRefOpaque_*,_128U>::operator[]
                        (&ctx->functions,node->function->functionIndex);
    pLVar9 = *ppLVar7;
    pLVar8 = CompileLlvmType(ctx,ctx->ctx->typeNullPtr);
    pLVar9 = LLVMBuildPointerCast(pLVar2,pLVar9,pLVar8,"func_ptr");
    pLVar8 = CompileLlvmType(ctx,ctx->ctx->typeNullPtr);
    result = LLVMConstPointerNull(pLVar8);
    pLVar8 = CompileLlvmType(ctx,ctx->ctx->typeNullPtr);
    constants[0] = LLVMConstPointerNull(pLVar8);
    pLVar8 = CompileLlvmType(ctx,(node->super_ExprBase).type);
    currentFunction = LLVMConstNamedStruct(pLVar8,&result,2);
    currentFunction = LLVMBuildInsertValue(ctx->builder,currentFunction,pLVar9,1,"");
    ctx_local = (LlvmCompilationContext *)CheckType(ctx,&node->super_ExprBase,currentFunction);
  }
  return (LLVMValueRef)ctx_local;
}

Assistant:

LLVMValueRef CompileLlvmFunctionDefinition(LlvmCompilationContext &ctx, ExprFunctionDefinition *node)
{
	LLVMValueRef function = ctx.functions[node->function->functionIndex];

	if(ctx.skipFunctionDefinitions)
	{
		LLVMValueRef function = LLVMBuildPointerCast(ctx.builder, ctx.functions[node->function->functionIndex], CompileLlvmType(ctx, ctx.ctx.typeNullPtr), "func_ptr");

		LLVMValueRef constants[] = { LLVMConstPointerNull(CompileLlvmType(ctx, ctx.ctx.typeNullPtr)), LLVMConstPointerNull(CompileLlvmType(ctx, ctx.ctx.typeNullPtr)) };

		LLVMValueRef result = LLVMConstNamedStruct(CompileLlvmType(ctx, node->type), constants, 2);

		result = LLVMBuildInsertValue(ctx.builder, result, function, 1, "");

		return CheckType(ctx, node, result);
	}

	if(node->function->isPrototype)
		return NULL;

	ctx.skipFunctionDefinitions = true;

	// Store state
	LLVMValueRef currentFunction = ctx.currentFunction;
	FunctionData *currentFunctionSource = ctx.currentFunctionSource;

	// Switch to new function
	ctx.currentFunction = function;
	ctx.currentFunctionSource = node->function;

	assert(ctx.currentNextRestoreBlock == 0);
	assert(ctx.currentRestoreBlocks.empty());

	LLVMBasicBlockRef block = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "start");

	LLVMPositionBuilderAtEnd(ctx.builder, block);

	// Allocate all arguments
	unsigned argIndex = 0;

	if(IsStructReturnType(node->function->type->returnType))
		argIndex++;

	for(VariableHandle *curr = node->function->argumentVariables.head; curr; curr = curr->next)
	{
		VariableData *variable = curr->variable;

		if(IsStructArgumentType(variable->type))
		{
			LLVMValueRef argument = LLVMGetParam(function, argIndex++);

			assert(!ctx.variables.find(variable->uniqueId));

			ctx.variables.insert(variable->uniqueId, argument);
		}
		else
		{
			LLVMValueRef storage = LLVMBuildAlloca(ctx.builder, CompileLlvmType(ctx, variable->type), CreateLlvmName(ctx, variable->name->name));

			LLVMValueRef argument = LLVMGetParam(function, argIndex++);

			LLVMBuildStore(ctx.builder, argument, storage);

			assert(!ctx.variables.find(variable->uniqueId));

			ctx.variables.insert(variable->uniqueId, storage);
		}
	}

	if(VariableData *variable = node->function->contextArgument)
	{
		LLVMValueRef storage = LLVMBuildAlloca(ctx.builder, CompileLlvmType(ctx, variable->type), CreateLlvmName(ctx, variable->name->name));

		LLVMValueRef argument = LLVMGetParam(function, argIndex++);

		argument = LLVMBuildPointerCast(ctx.builder, argument, CompileLlvmType(ctx, node->function->contextType), "context_reinterpret");

		LLVMBuildStore(ctx.builder, argument, storage);

		assert(!ctx.variables.find(variable->uniqueId));

		ctx.variables.insert(variable->uniqueId, storage);
	}

	// Generate variables for all locals
	for(unsigned i = 0; i < node->function->functionScope->allVariables.size(); i++)
	{
		VariableData *variable = node->function->functionScope->allVariables[i];

		bool isArgument = false;

		for(VariableHandle *curr = node->function->argumentVariables.head; curr; curr = curr->next)
		{
			if(variable == curr->variable)
			{
				isArgument = true;
				break;
			}
		}

		if(isArgument || variable == node->function->contextArgument)
			continue;

		LLVMValueRef storage = LLVMBuildAlloca(ctx.builder, CompileLlvmType(ctx, variable->type), CreateLlvmName(ctx, variable->name->name));

		assert(!ctx.variables.find(variable->uniqueId));

		ctx.variables.insert(variable->uniqueId, storage);
	}

	if(node->function->coroutine)
	{
		LLVMValueRef state = CompileLlvm(ctx, node->coroutineStateRead);

		LLVMBasicBlockRef startBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "start");

		LLVMValueRef switchInst = LLVMBuildSwitch(ctx.builder, state, startBlock, node->function->yieldCount);

		LLVMPositionBuilderAtEnd(ctx.builder, startBlock);

		for(unsigned i = 0; i < node->function->yieldCount; i++)
		{
			LLVMBasicBlockRef restoreBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "restore");

			LLVMAddCase(switchInst, LLVMConstInt(CompileLlvmType(ctx, ctx.ctx.typeInt), i + 1, true), restoreBlock);

			ctx.currentRestoreBlocks.push_back(restoreBlock);
		}
	}

	for(ExprBase *value = node->expressions.head; value; value = value->next)
		CompileLlvm(ctx, value);

	LLVMBuildCall(ctx.builder, LLVMGetNamedFunction(ctx.module, "__llvmAbortNoReturn"), NULL, 0, "");

	if(node->function->type->returnType == ctx.ctx.typeVoid || IsStructReturnType(node->function->type->returnType))
		LLVMBuildRetVoid(ctx.builder);
	else
		LLVMBuildRet(ctx.builder, LLVMConstNull(CompileLlvmType(ctx, node->function->type->returnType)));

	CheckFunction(ctx, ctx.currentFunction, node->function->name->name);

	if(LLVMRunFunctionPassManager(ctx.functionPassManager, function))
		LLVMRunFunctionPassManager(ctx.functionPassManager, function);

	// Restore state
	ctx.currentFunction = currentFunction;
	ctx.currentFunctionSource = currentFunctionSource;

	ctx.currentNextRestoreBlock = 0;
	ctx.currentRestoreBlocks.clear();

	ctx.skipFunctionDefinitions = false;

	return NULL;
}